

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

SparseArraySegmentBase * __thiscall
Js::JavascriptArray::GetBeginLookupSegment(JavascriptArray *this,uint32 index,bool useSegmentMap)

{
  SparseArraySegmentBase *pSVar1;
  SparseArraySegmentBase *pSVar2;
  SegmentBTreeRoot *this_00;
  SparseArraySegmentBase *local_38;
  SparseArraySegmentBase *matchOrNextSeg;
  SparseArraySegmentBase *seg;
  
  matchOrNextSeg = (SparseArraySegmentBase *)0x0;
  pSVar2 = GetLastUsedSegment(this);
  if ((pSVar2 == (SparseArraySegmentBase *)0x0) || (index < pSVar2->left)) {
    pSVar2 = (SparseArraySegmentBase *)0x0;
  }
  else {
    matchOrNextSeg = pSVar2;
    if (index - pSVar2->left < pSVar2->size) {
      return pSVar2;
    }
  }
  this_00 = GetSegmentMap(this);
  if (this_00 == (SegmentBTreeRoot *)0x0 || !useSegmentMap) {
    if (pSVar2 == (SparseArraySegmentBase *)0x0) {
      pSVar2 = (this->head).ptr;
    }
  }
  else if ((((pSVar2 == (SparseArraySegmentBase *)0x0) ||
            (pSVar1 = (pSVar2->next).ptr, pSVar1 == (SparseArraySegmentBase *)0x0)) ||
           ((pSVar1->left <= index && (pSVar2 = pSVar1, pSVar1->size <= index - pSVar1->left)))) &&
          (SegmentBTreeRoot::Find(this_00,index,&matchOrNextSeg,&local_38), pSVar2 = matchOrNextSeg,
          matchOrNextSeg == (SparseArraySegmentBase *)0x0)) {
    pSVar2 = local_38;
  }
  return pSVar2;
}

Assistant:

SparseArraySegmentBase * JavascriptArray::GetBeginLookupSegment(uint32 index, const bool useSegmentMap) const
    {
        SparseArraySegmentBase *seg = nullptr;
        SparseArraySegmentBase * lastUsedSeg = this->GetLastUsedSegment();
        if (lastUsedSeg != nullptr && lastUsedSeg->left <= index)
        {
            seg = lastUsedSeg;
            if(index - lastUsedSeg->left < lastUsedSeg->size)
            {
                return seg;
            }
        }

        SegmentBTreeRoot * segmentMap = GetSegmentMap();
        if(!useSegmentMap || !segmentMap)
        {
            return seg ? seg : PointerValue(this->head);
        }

        if(seg)
        {
            // If indexes are being accessed sequentially, check the segment after the last-used segment before checking the
            // segment map, as it is likely to hit
            SparseArraySegmentBase *const nextSeg = seg->next;
            if(nextSeg)
            {
                if(index < nextSeg->left)
                {
                    return seg;
                }
                else if(index - nextSeg->left < nextSeg->size)
                {
                    return nextSeg;
                }
            }
        }

        SparseArraySegmentBase *matchOrNextSeg;
        segmentMap->Find(index, seg, matchOrNextSeg);
        return seg ? seg : matchOrNextSeg;
    }